

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SourceCodeOperations.cpp
# Opt level: O2

bool __thiscall
soul::SourceCodeOperations::reparse
          (SourceCodeOperations *this,CompileMessageList *messageList,CodeLocation *code)

{
  bool bVar1;
  Namespace *pNVar2;
  pool_ref<soul::AST::ModuleBase> *m;
  pointer ppVar3;
  CompileMessageHandler handler;
  CodeLocation local_78;
  _Vector_base<soul::pool_ref<soul::AST::ModuleBase>,_std::allocator<soul::pool_ref<soul::AST::ModuleBase>_>_>
  local_60;
  CompileMessageHandler local_48;
  
  clear(this);
  CodeLocation::operator=(&this->source,code);
  CompileMessageHandler::CompileMessageHandler(&local_48,messageList);
  pNVar2 = AST::createRootNamespace(&this->allocator);
  (this->topLevelNamespace).object = pNVar2;
  local_78.sourceCode.object = (code->sourceCode).object;
  local_78.location.data = (code->location).data;
  (code->sourceCode).object = (SourceCodeText *)0x0;
  pNVar2 = pool_ptr<soul::AST::Namespace>::operator*(&this->topLevelNamespace);
  Compiler::parseTopLevelDeclarations
            ((vector<soul::pool_ref<soul::AST::ModuleBase>,_std::allocator<soul::pool_ref<soul::AST::ModuleBase>_>_>
              *)&local_60,&this->allocator,&local_78,pNVar2);
  RefCountedPtr<soul::SourceCodeText>::~RefCountedPtr(&local_78.sourceCode);
  for (ppVar3 = local_60._M_impl.super__Vector_impl_data._M_start;
      ppVar3 != local_60._M_impl.super__Vector_impl_data._M_finish; ppVar3 = ppVar3 + 1) {
    recurseFindingModules(this,ppVar3->object);
  }
  std::
  _Vector_base<soul::pool_ref<soul::AST::ModuleBase>,_std::allocator<soul::pool_ref<soul::AST::ModuleBase>_>_>
  ::~_Vector_base(&local_60);
  CompileMessageHandler::~CompileMessageHandler(&local_48);
  bVar1 = CompileMessageList::hasErrors(messageList);
  return !bVar1;
}

Assistant:

bool SourceCodeOperations::reparse (CompileMessageList& messageList, CodeLocation code)
{
    clear();
    source = code;

    try
    {
        CompileMessageHandler handler (messageList);
        topLevelNamespace = AST::createRootNamespace (allocator);

        for (auto& m : Compiler::parseTopLevelDeclarations (allocator, std::move (code), *topLevelNamespace))
            recurseFindingModules (m);
    }
    catch (AbortCompilationException)
    {
        clear();
    }

    return ! messageList.hasErrors();
}